

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

cmInstallRuntimeDependencySet * __thiscall
cmGlobalGenerator::CreateAnonymousRuntimeDependencySet(cmGlobalGenerator *this)

{
  __single_object set;
  unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>
  local_20;
  
  std::make_unique<cmInstallRuntimeDependencySet>();
  std::
  vector<std::unique_ptr<cmInstallRuntimeDependencySet,std::default_delete<cmInstallRuntimeDependencySet>>,std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet,std::default_delete<cmInstallRuntimeDependencySet>>>>
  ::
  emplace_back<std::unique_ptr<cmInstallRuntimeDependencySet,std::default_delete<cmInstallRuntimeDependencySet>>>
            ((vector<std::unique_ptr<cmInstallRuntimeDependencySet,std::default_delete<cmInstallRuntimeDependencySet>>,std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet,std::default_delete<cmInstallRuntimeDependencySet>>>>
              *)&this->RuntimeDependencySets,&local_20);
  std::
  unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>::
  ~unique_ptr(&local_20);
  return (cmInstallRuntimeDependencySet *)
         (tuple<cmInstallRuntimeDependencySet_*,_std::default_delete<cmInstallRuntimeDependencySet>_>
          )local_20._M_t.
           super___uniq_ptr_impl<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmInstallRuntimeDependencySet_*,_std::default_delete<cmInstallRuntimeDependencySet>_>
           .super__Head_base<0UL,_cmInstallRuntimeDependencySet_*,_false>._M_head_impl;
}

Assistant:

cmInstallRuntimeDependencySet*
cmGlobalGenerator::CreateAnonymousRuntimeDependencySet()
{
  auto set = cm::make_unique<cmInstallRuntimeDependencySet>();
  auto* retval = set.get();
  this->RuntimeDependencySets.push_back(std::move(set));
  return retval;
}